

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O0

void __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::setStorage(ArrayBuffer<int,_4UL,_4UL> *this,size_t numElements)

{
  undefined1 local_28 [8];
  ArrayBuffer<int,_4UL,_4UL> newBuffer;
  size_t numElements_local;
  ArrayBuffer<int,_4UL,_4UL> *this_local;
  
  newBuffer.m_cap = numElements;
  ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_28,numElements);
  swap(this,(ArrayBuffer<int,_4UL,_4UL> *)local_28);
  ~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_28);
  return;
}

Assistant:

void ArrayBuffer<T,Alignment,Stride>::setStorage (size_t numElements)
{
	// create new buffer of the wanted size, swap to it
	ArrayBuffer<T,Alignment,Stride> newBuffer(numElements);
	swap(newBuffer);
}